

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode multi_socket(Curl_multi *multi,_Bool checkall,curl_socket_t s,int ev_bitmask,
                      int *running_handles)

{
  Curl_sh_entry *pCVar1;
  Curl_tree *pCVar2;
  curltime cVar3;
  curltime now_00;
  curltime i;
  curltime now_01;
  undefined1 local_1c0 [8];
  sigpipe_ignore pipe_st_1;
  undefined1 local_110 [8];
  sigpipe_ignore pipe_st;
  curl_llist_element *e;
  curl_llist *list;
  Curl_sh_entry *entry;
  curltime now;
  Curl_tree *t;
  Curl_easy *data;
  CURLMcode result;
  int *running_handles_local;
  int ev_bitmask_local;
  curl_socket_t s_local;
  _Bool checkall_local;
  Curl_multi *multi_local;
  
  data._4_4_ = CURLM_OK;
  cVar3 = Curl_now();
  entry = (Curl_sh_entry *)cVar3.tv_sec;
  now.tv_sec._0_4_ = cVar3.tv_usec;
  if (checkall) {
    data._4_4_ = curl_multi_perform(multi,running_handles);
    if (data._4_4_ != CURLM_BAD_HANDLE) {
      for (t = (Curl_tree *)multi->easyp; t != (Curl_tree *)0x0 && data._4_4_ == CURLM_OK;
          t = t->smaller) {
        data._4_4_ = singlesocket(multi,(Curl_easy *)t);
      }
    }
    multi_local._4_4_ = data._4_4_;
  }
  else {
    if (s == -1) {
      memset(&multi->timer_lastcall,0,0x10);
    }
    else {
      pCVar1 = sh_getentry(&multi->sockhash,s);
      if (pCVar1 != (Curl_sh_entry *)0x0) {
        for (pipe_st._152_8_ = (pCVar1->list).head; pipe_st._152_8_ != 0;
            pipe_st._152_8_ = *(undefined8 *)(pipe_st._152_8_ + 0x10)) {
          t = *(Curl_tree **)pipe_st._152_8_;
          if (t[0x6c].key.tv_usec != -0x3f212453) {
            return CURLM_INTERNAL_ERROR;
          }
          if (t->samen != (Curl_tree *)0x0) {
            if (((ev_bitmask & 2U) == 0) || (t->samen[0x14].samen == (Curl_tree *)0x0)) {
              if (((ev_bitmask & 1U) != 0) && (t->samen[0x14].payload != (void *)0x0)) {
                t = *t->samen[0x14].payload;
              }
            }
            else {
              t = (t->samen[0x14].samen)->smaller;
            }
          }
          if ((t->samen != (Curl_tree *)0x0) &&
             ((*(uint *)(*(long *)&t->samen[0x11].key.tv_usec + 0x84) & 8) == 0)) {
            *(int *)&t->samen[0x21].larger = ev_bitmask;
          }
          sigpipe_ignore((Curl_easy *)t,(sigpipe_ignore *)local_110);
          cVar3.tv_usec = (int)now.tv_sec;
          cVar3.tv_sec = (time_t)entry;
          cVar3._12_4_ = 0;
          data._4_4_ = multi_runsingle(multi,cVar3,(Curl_easy *)t);
          sigpipe_restore((sigpipe_ignore *)local_110);
          if ((t->samen != (Curl_tree *)0x0) &&
             ((*(uint *)(*(long *)&t->samen[0x11].key.tv_usec + 0x84) & 8) == 0)) {
            *(undefined4 *)&t->samen[0x21].larger = 0;
          }
          if ((data._4_4_ < CURLM_BAD_HANDLE) &&
             (data._4_4_ = singlesocket(multi,(Curl_easy *)t), data._4_4_ != CURLM_OK)) {
            return data._4_4_;
          }
        }
        cVar3 = Curl_now();
        pipe_st_1._152_8_ = cVar3.tv_sec;
        now.tv_sec._0_4_ = cVar3.tv_usec;
        entry = (Curl_sh_entry *)pipe_st_1._152_8_;
      }
    }
    t = (Curl_tree *)0x0;
    do {
      if (t != (Curl_tree *)0x0) {
        sigpipe_ignore((Curl_easy *)t,(sigpipe_ignore *)local_1c0);
        now_00.tv_usec = (int)now.tv_sec;
        now_00.tv_sec = (time_t)entry;
        now_00._12_4_ = 0;
        data._4_4_ = multi_runsingle(multi,now_00,(Curl_easy *)t);
        sigpipe_restore((sigpipe_ignore *)local_1c0);
        if ((data._4_4_ < CURLM_BAD_HANDLE) &&
           (data._4_4_ = singlesocket(multi,(Curl_easy *)t), data._4_4_ != CURLM_OK)) {
          return data._4_4_;
        }
      }
      i.tv_usec = (int)now.tv_sec;
      i.tv_sec = (time_t)entry;
      i._12_4_ = 0;
      pCVar2 = Curl_splaygetbest(i,multi->timetree,(Curl_tree **)&now.tv_usec);
      multi->timetree = pCVar2;
      if (now._8_8_ != 0) {
        t = *(Curl_tree **)(now._8_8_ + 0x30);
        now_01.tv_usec = (int)now.tv_sec;
        now_01.tv_sec = (time_t)entry;
        now_01._12_4_ = 0;
        add_next_timeout(now_01,multi,*(Curl_easy **)(now._8_8_ + 0x30));
      }
    } while (now._8_8_ != 0);
    *running_handles = multi->num_alive;
    multi_local._4_4_ = data._4_4_;
  }
  return multi_local._4_4_;
}

Assistant:

static CURLMcode multi_socket(struct Curl_multi *multi,
                              bool checkall,
                              curl_socket_t s,
                              int ev_bitmask,
                              int *running_handles)
{
  CURLMcode result = CURLM_OK;
  struct Curl_easy *data = NULL;
  struct Curl_tree *t;
  struct curltime now = Curl_now();

  if(checkall) {
    /* *perform() deals with running_handles on its own */
    result = curl_multi_perform(multi, running_handles);

    /* walk through each easy handle and do the socket state change magic
       and callbacks */
    if(result != CURLM_BAD_HANDLE) {
      data = multi->easyp;
      while(data && !result) {
        result = singlesocket(multi, data);
        data = data->next;
      }
    }

    /* or should we fall-through and do the timer-based stuff? */
    return result;
  }
  if(s != CURL_SOCKET_TIMEOUT) {

    struct Curl_sh_entry *entry = sh_getentry(&multi->sockhash, s);

    if(!entry)
      /* Unmatched socket, we can't act on it but we ignore this fact.  In
         real-world tests it has been proved that libevent can in fact give
         the application actions even though the socket was just previously
         asked to get removed, so thus we better survive stray socket actions
         and just move on. */
      ;
    else {
      struct curl_llist *list = &entry->list;
      struct curl_llist_element *e;
      SIGPIPE_VARIABLE(pipe_st);

      /* the socket can be shared by many transfers, iterate */
      for(e = list->head; e; e = e->next) {
        data = (struct Curl_easy *)e->ptr;

        if(data->magic != CURLEASY_MAGIC_NUMBER)
          /* bad bad bad bad bad bad bad */
          return CURLM_INTERNAL_ERROR;

        /* If the pipeline is enabled, take the handle which is in the head of
           the pipeline. If we should write into the socket, take the
           send_pipe head. If we should read from the socket, take the
           recv_pipe head. */
        if(data->conn) {
          if((ev_bitmask & CURL_POLL_OUT) &&
             data->conn->send_pipe.head)
            data = data->conn->send_pipe.head->ptr;
          else if((ev_bitmask & CURL_POLL_IN) &&
                  data->conn->recv_pipe.head)
            data = data->conn->recv_pipe.head->ptr;
        }

        if(data->conn && !(data->conn->handler->flags & PROTOPT_DIRLOCK))
          /* set socket event bitmask if they're not locked */
          data->conn->cselect_bits = ev_bitmask;

        sigpipe_ignore(data, &pipe_st);
        result = multi_runsingle(multi, now, data);
        sigpipe_restore(&pipe_st);

        if(data->conn && !(data->conn->handler->flags & PROTOPT_DIRLOCK))
          /* clear the bitmask only if not locked */
          data->conn->cselect_bits = 0;

        if(CURLM_OK >= result) {
          /* get the socket(s) and check if the state has been changed since
             last */
          result = singlesocket(multi, data);
          if(result)
            return result;
        }
      }

      /* Now we fall-through and do the timer-based stuff, since we don't want
         to force the user to have to deal with timeouts as long as at least
         one connection in fact has traffic. */

      data = NULL; /* set data to NULL again to avoid calling
                      multi_runsingle() in case there's no need to */
      now = Curl_now(); /* get a newer time since the multi_runsingle() loop
                           may have taken some time */
    }
  }
  else {
    /* Asked to run due to time-out. Clear the 'lastcall' variable to force
       update_timer() to trigger a callback to the app again even if the same
       timeout is still the one to run after this call. That handles the case
       when the application asks libcurl to run the timeout prematurely. */
    memset(&multi->timer_lastcall, 0, sizeof(multi->timer_lastcall));
  }

  /*
   * The loop following here will go on as long as there are expire-times left
   * to process in the splay and 'data' will be re-assigned for every expired
   * handle we deal with.
   */
  do {
    /* the first loop lap 'data' can be NULL */
    if(data) {
      SIGPIPE_VARIABLE(pipe_st);

      sigpipe_ignore(data, &pipe_st);
      result = multi_runsingle(multi, now, data);
      sigpipe_restore(&pipe_st);

      if(CURLM_OK >= result) {
        /* get the socket(s) and check if the state has been changed since
           last */
        result = singlesocket(multi, data);
        if(result)
          return result;
      }
    }

    /* Check if there's one (more) expired timer to deal with! This function
       extracts a matching node if there is one */

    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t) {
      data = t->payload; /* assign this for next loop */
      (void)add_next_timeout(now, multi, t->payload);
    }

  } while(t);

  *running_handles = multi->num_alive;
  return result;
}